

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::convert_packing(Mat *src,Mat *dst,int _elempack,Option *opt)

{
  Layer *pLVar1;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ParamDict pd;
  Layer *packing;
  ParamDict *this;
  undefined1 local_38 [4];
  int in_stack_ffffffffffffffcc;
  ParamDict *in_stack_ffffffffffffffd0;
  
  pLVar1 = create_layer(in_stack_ffffffffffffffcc);
  this = (ParamDict *)local_38;
  ParamDict::ParamDict(in_stack_ffffffffffffffd0);
  ParamDict::set(this,0,in_EDX);
  (*pLVar1->_vptr_Layer[2])(pLVar1,local_38);
  (*pLVar1->_vptr_Layer[4])(pLVar1,in_RCX);
  (*pLVar1->_vptr_Layer[7])(pLVar1,in_RDI,in_RSI,in_RCX);
  (*pLVar1->_vptr_Layer[5])(pLVar1,in_RCX);
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict(this);
  return;
}

Assistant:

void convert_packing(const Mat& src, Mat& dst, int _elempack, const Option& opt)
{
    Layer* packing = create_layer(LayerType::Packing);

    ParamDict pd;
    pd.set(0, _elempack);

    packing->load_param(pd);

    packing->create_pipeline(opt);

    packing->forward(src, dst, opt);

    packing->destroy_pipeline(opt);

    delete packing;
}